

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

FlagTypes Js::ConfigFlagsTable::GetFlagType(Flag flag)

{
  FlagTypes FVar1;
  
  FVar1 = InvalidFlagType;
  if (flag < FlagCount) {
    FVar1 = *(FlagTypes *)(&DAT_00df5aa0 + (ulong)flag * 4);
  }
  return FVar1;
}

Assistant:

FlagTypes
    ConfigFlagsTable::GetFlagType(Flag flag)
    {
        switch(flag)
        {
    #define FLAG(type, name, ...) \
            case name##Flag : \
                return Flag##type; \

    #include "ConfigFlagsList.h"

            default:
                return InvalidFlagType;
        }
    }